

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOV(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  if (size != sDWORD && size != sQWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x350,"int x86MOV(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
  }
  uVar1 = encodeRex(stream,size == sQWORD,dst,index,base);
  puVar2 = stream + uVar1;
  if ((((dst == rEAX) && ((char)shift != shift)) && (index == rNONE)) && (base == rNONE)) {
    *puVar2 = 0xa1;
    uVar1 = encodeImmDword(puVar2 + 1,shift);
    stream_local._4_4_ = ((int)(puVar2 + 1) + uVar1) - (int)stream;
  }
  else {
    *puVar2 = 0x8b;
    uVar1 = encodeAddress(puVar2 + 1,index,multiplier,base,shift,(int)regCode[dst]);
    stream_local._4_4_ = ((int)(puVar2 + 1) + uVar1) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86MOV(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, dst, index, base);

	if(dst == rEAX && (char)(shift) != shift && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa1;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x8b;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}